

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void luaC_freeallobjects(lua_State *L)

{
  global_State *g_00;
  global_State *g;
  lua_State *L_local;
  
  g_00 = L->l_G;
  separatetobefnz(g_00,1);
  callallpendingfinalizers(L);
  g_00->currentwhite = '\x03';
  g_00->gckind = '\0';
  sweeplist(L,&g_00->finobj,0xffffffffffffffff);
  sweeplist(L,&g_00->allgc,0xffffffffffffffff);
  sweeplist(L,&g_00->fixedgc,0xffffffffffffffff);
  return;
}

Assistant:

void luaC_freeallobjects(lua_State *L) {
    global_State *g = G(L);
    separatetobefnz(g, 1);  /* separate all objects with finalizers */
    lua_assert(g->finobj == NULL);
    callallpendingfinalizers(L);
    lua_assert(g->tobefnz == NULL);
    g->currentwhite = WHITEBITS; /* this "white" makes all objects look dead */
    g->gckind = KGC_NORMAL;
    sweepwholelist(L, &g->finobj);
    sweepwholelist(L, &g->allgc);
    sweepwholelist(L, &g->fixedgc);  /* collect fixed objects */
    lua_assert(g->strt.nuse == 0);
}